

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigJust.c
# Opt level: O0

int Aig_ObjTerSimulate(Aig_Man_t *pAig,Aig_Obj_t *pNode,Vec_Int_t *vSuppLits)

{
  int iVar1;
  int iVar2;
  Aig_Obj_t *pNode_00;
  undefined4 local_2c;
  int Entry;
  int i;
  Aig_Obj_t *pObj;
  Vec_Int_t *vSuppLits_local;
  Aig_Obj_t *pNode_local;
  Aig_Man_t *pAig_local;
  
  Aig_ManIncrementTravId(pAig);
  for (local_2c = 0; iVar1 = Vec_IntSize(vSuppLits), local_2c < iVar1; local_2c = local_2c + 1) {
    iVar1 = Vec_IntEntry(vSuppLits,local_2c);
    iVar2 = Abc_Lit2Var(iVar1);
    pNode_00 = Aig_ManCi(pAig,iVar2);
    iVar2 = Abc_LitIsCompl(iVar1);
    iVar1 = 2;
    if (iVar2 != 0) {
      iVar1 = 1;
    }
    Aig_ObjSetTerValue(pNode_00,iVar1);
    Aig_ObjSetTravIdCurrent(pAig,pNode_00);
  }
  iVar1 = Aig_ObjTerSimulate_rec(pAig,pNode);
  return iVar1;
}

Assistant:

int Aig_ObjTerSimulate( Aig_Man_t * pAig, Aig_Obj_t * pNode, Vec_Int_t * vSuppLits )
{
    Aig_Obj_t * pObj;
    int i, Entry;
    Aig_ManIncrementTravId( pAig );
    Vec_IntForEachEntry( vSuppLits, Entry, i )
    {
        pObj = Aig_ManCi( pAig, Abc_Lit2Var(Entry) );
        Aig_ObjSetTerValue( pObj, Abc_LitIsCompl(Entry) ? AIG_VAL0 : AIG_VAL1 );
        Aig_ObjSetTravIdCurrent( pAig, pObj );
//printf( "%d ", Entry );
    }
//printf( "\n" );
    return Aig_ObjTerSimulate_rec( pAig, pNode );
}